

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook_state.cpp
# Opt level: O2

void __thiscall
HookStateStepIn::ProcessHook
          (HookStateStepIn *this,shared_ptr<Debugger> *debugger,lua_State *L,lua_Debug *ar)

{
  bool bVar1;
  int iVar2;
  char *__rhs;
  lua_Debug *ar_00;
  __shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  ar_00 = ar;
  std::__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>);
  StackLevelBasedState::UpdateStackLevel
            (&this->super_StackLevelBasedState,(shared_ptr<Debugger> *)&local_50,L,ar_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  iVar2 = getDebugEvent(ar);
  if (iVar2 == 2) {
    (*lua_getinfo)(L,"nSl",ar);
    iVar2 = getDebugCurrentLine(ar);
    __rhs = getDebugSource(ar);
    if ((iVar2 == this->line) && (bVar1 = std::operator!=(&this->file,__rhs), !bVar1)) {
      return;
    }
    Debugger::HandleBreak
              ((debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  else {
    std::__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  return;
}

Assistant:

void HookStateStepIn::ProcessHook(std::shared_ptr<Debugger> debugger, lua_State* L, lua_Debug* ar)
{
	UpdateStackLevel(debugger, L, ar);
	if (getDebugEvent(ar) == LUA_HOOKLINE)
	{
		lua_getinfo(L, "nSl", ar);
		auto currentLine = getDebugCurrentLine(ar);
		auto source = getDebugSource(ar);
		if(currentLine != line || file != source)
		{
			debugger->HandleBreak();
		}
		return;
	}

	StackLevelBasedState::ProcessHook(debugger, L, ar);
}